

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_markdown_generator.cc
# Opt level: O3

void __thiscall t_markdown_generator::generate_program(t_markdown_generator *this)

{
  ofstream_with_content_based_conditional_update *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer *ppptVar2;
  pointer pcVar3;
  int iVar4;
  int *piVar5;
  long *plVar6;
  ostream *poVar7;
  long lVar8;
  t_program *ptVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  char *__rhs;
  size_type *psVar10;
  vector<t_const_*,_std::allocator<t_const_*>_> *pvVar11;
  pointer pptVar12;
  pointer pptVar13;
  vector<t_const_*,_std::allocator<t_const_*>_> consts;
  string fname;
  string pname;
  vector<t_service_*,_std::allocator<t_service_*>_> services;
  vector<t_const_*,_std::allocator<t_const_*>_> local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  vector<t_service_*,_std::allocator<t_service_*>_> local_80;
  vector<t_const_*,_std::allocator<t_const_*>_> local_68;
  string local_50;
  
  (*(this->super_t_generator)._vptr_t_generator[0x1b])(&local_a0,this);
  iVar4 = mkdir(local_a0._M_dataplus._M_p,0x1ff);
  paVar1 = &local_a0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((iVar4 == -1) && (piVar5 = __errno_location(), *piVar5 != 0x11)) {
    __return_storage_ptr__ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         __cxa_allocate_exception(0x20);
    (*(this->super_t_generator)._vptr_t_generator[0x1b])(&local_e0,this);
    std::__cxx11::string::string
              ((string *)&local_c0,
               (char *)CONCAT71(local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>.
                                _M_impl.super__Vector_impl_data._M_start._1_7_,
                                local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>.
                                _M_impl.super__Vector_impl_data._M_start._0_1_),
               (allocator *)&local_80);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_c0);
    local_a0._M_dataplus._M_p = (pointer)*plVar6;
    psVar10 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_a0._M_dataplus._M_p == psVar10) {
      local_a0.field_2._M_allocated_capacity = *psVar10;
      local_a0.field_2._8_8_ = plVar6[3];
      local_a0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_a0.field_2._M_allocated_capacity = *psVar10;
    }
    local_a0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    __rhs = strerror(*piVar5);
    std::operator+(__return_storage_ptr__,&local_a0,__rhs);
    __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string
               );
  }
  ptVar9 = (this->super_t_generator).program_;
  pcVar3 = (ptVar9->name_)._M_dataplus._M_p;
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar3,pcVar3 + (ptVar9->name_)._M_string_length);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,local_a0._M_dataplus._M_p,
             local_a0._M_dataplus._M_p + local_a0._M_string_length);
  make_file_name(&local_c0,this,&local_50);
  std::__cxx11::string::operator=((string *)&this->current_file_,(string *)&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  (*(this->super_t_generator)._vptr_t_generator[0x1b])(&local_e0,this);
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_e0,(ulong)(this->current_file_)._M_dataplus._M_p);
  psVar10 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_c0.field_2._M_allocated_capacity = *psVar10;
    local_c0.field_2._8_8_ = plVar6[3];
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  }
  else {
    local_c0.field_2._M_allocated_capacity = *psVar10;
    local_c0._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_c0._M_string_length = plVar6[1];
  *plVar6 = (long)psVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  ppptVar2 = &local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  if ((pointer *)
      CONCAT71(local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
               super__Vector_impl_data._M_start._1_7_,
               local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
               super__Vector_impl_data._M_start._0_1_) != ppptVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>.
                             _M_impl.super__Vector_impl_data._M_start._1_7_,
                             local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>.
                             _M_impl.super__Vector_impl_data._M_start._0_1_));
  }
  std::__cxx11::string::string((string *)&local_e0,local_c0._M_dataplus._M_p,(allocator *)&local_80)
  ;
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->f_out_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
              field_0x70);
  this_00 = &this->f_out_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::clear_buf
            (this_00);
  (this->f_out_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x90 =
       0;
  if ((pointer *)
      CONCAT71(local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
               super__Vector_impl_data._M_start._1_7_,
               local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
               super__Vector_impl_data._M_start._0_1_) != ppptVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>.
                             _M_impl.super__Vector_impl_data._M_start._1_7_,
                             local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>.
                             _M_impl.super__Vector_impl_data._M_start._0_1_));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"# Thrift module: ",0x11);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this_00,local_a0._M_dataplus._M_p,local_a0._M_string_length);
  local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.super__Vector_impl_data
  ._M_start._0_1_ = (string)0xa;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_e0,1);
  local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.super__Vector_impl_data
  ._M_start._0_1_ = (string)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_e0,1);
  print_doc(this,&((this->super_t_generator).program_)->super_t_doc);
  local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.super__Vector_impl_data
  ._M_start._0_1_ = (string)0xa;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this_00,(char *)&local_e0,1);
  local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.super__Vector_impl_data
  ._M_start._0_1_ = (string)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_e0,1);
  generate_program_toc(this);
  ptVar9 = (this->super_t_generator).program_;
  if ((ptVar9->consts_).super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (ptVar9->consts_).super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"***",3);
    local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = (string)0xa;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)this_00,(char *)&local_e0,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"## Constants",0xc);
    local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = (string)0xa;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_e0,1);
    local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_e0,1);
    std::vector<t_const_*,_std::allocator<t_const_*>_>::vector
              (&local_e0,&((this->super_t_generator).program_)->consts_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"|Constant|Type|Value||",0x16);
    local_80.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = (allocator)0xa;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)this_00,(char *)&local_80,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"|---|---|---|---|",0x11);
    local_80.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = (allocator)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_80,1);
    std::vector<t_const_*,_std::allocator<t_const_*>_>::vector(&local_68,&local_e0);
    (*(this->super_t_generator)._vptr_t_generator[0x11])(this,&local_68);
    if (local_68.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_80.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = (allocator)0xa;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,(char *)&local_80,1);
    if ((void *)CONCAT71(local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,
                         local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
                         super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
      operator_delete((void *)CONCAT71(local_e0.
                                       super__Vector_base<t_const_*,_std::allocator<t_const_*>_>.
                                       _M_impl.super__Vector_impl_data._M_start._1_7_,
                                       local_e0.
                                       super__Vector_base<t_const_*,_std::allocator<t_const_*>_>.
                                       _M_impl.super__Vector_impl_data._M_start._0_1_));
    }
    ptVar9 = (this->super_t_generator).program_;
  }
  if ((ptVar9->enums_).super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (ptVar9->enums_).super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"***",3);
    local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = (string)0xa;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)this_00,(char *)&local_e0,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"## Enumerations",0xf);
    local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = (string)0xa;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_e0,1);
    local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_e0,1);
    std::vector<t_enum_*,_std::allocator<t_enum_*>_>::vector
              ((vector<t_enum_*,_std::allocator<t_enum_*>_> *)&local_e0,
               &((this->super_t_generator).program_)->enums_);
    pptVar12 = (pointer)CONCAT71(local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start._1_7_,
                                 local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start._0_1_);
    if (pptVar12 !=
        local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        (*(this->super_t_generator)._vptr_t_generator[0x13])(this,*pptVar12);
        pptVar12 = pptVar12 + 1;
      } while (pptVar12 !=
               local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
      pptVar12 = (pointer)CONCAT71(local_e0.
                                   super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl
                                   .super__Vector_impl_data._M_start._1_7_,
                                   local_e0.
                                   super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl
                                   .super__Vector_impl_data._M_start._0_1_);
    }
    if (pptVar12 != (pointer)0x0) {
      operator_delete(pptVar12);
    }
    ptVar9 = (this->super_t_generator).program_;
  }
  if ((ptVar9->typedefs_).super__Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (ptVar9->typedefs_).super__Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"***",3);
    local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = (string)0xa;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)this_00,(char *)&local_e0,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"## Type declarations",0x14);
    local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = (string)0xa;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_e0,1);
    local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_e0,1);
    std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>::vector
              ((vector<t_typedef_*,_std::allocator<t_typedef_*>_> *)&local_e0,
               &((this->super_t_generator).program_)->typedefs_);
    pptVar12 = (pointer)CONCAT71(local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start._1_7_,
                                 local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start._0_1_);
    if (pptVar12 !=
        local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        (*(this->super_t_generator)._vptr_t_generator[0x12])(this,*pptVar12);
        pptVar12 = pptVar12 + 1;
      } while (pptVar12 !=
               local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
      pptVar12 = (pointer)CONCAT71(local_e0.
                                   super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl
                                   .super__Vector_impl_data._M_start._1_7_,
                                   local_e0.
                                   super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl
                                   .super__Vector_impl_data._M_start._0_1_);
    }
    if (pptVar12 != (pointer)0x0) {
      operator_delete(pptVar12);
    }
    ptVar9 = (this->super_t_generator).program_;
  }
  if ((ptVar9->objects_).super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (ptVar9->objects_).super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"***",3);
    local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = (string)0xa;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)this_00,(char *)&local_e0,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"## Data structures",0x12);
    local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = (string)0xa;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_e0,1);
    local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_e0,1);
    std::vector<t_struct_*,_std::allocator<t_struct_*>_>::vector
              ((vector<t_struct_*,_std::allocator<t_struct_*>_> *)&local_e0,
               &((this->super_t_generator).program_)->objects_);
    pptVar12 = (pointer)CONCAT71(local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start._1_7_,
                                 local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start._0_1_);
    if (pptVar12 !=
        local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        iVar4 = (*((*pptVar12)->super_t_doc)._vptr_t_doc[0xc])();
        lVar8 = 0xa8;
        if ((char)iVar4 != '\0') {
          lVar8 = 0xc0;
        }
        (**(code **)((long)(this->super_t_generator)._vptr_t_generator + lVar8))(this,*pptVar12);
        pptVar12 = pptVar12 + 1;
      } while (pptVar12 !=
               local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
      pptVar12 = (pointer)CONCAT71(local_e0.
                                   super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl
                                   .super__Vector_impl_data._M_start._1_7_,
                                   local_e0.
                                   super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl
                                   .super__Vector_impl_data._M_start._0_1_);
    }
    if (pptVar12 != (pointer)0x0) {
      operator_delete(pptVar12);
    }
    ptVar9 = (this->super_t_generator).program_;
  }
  if ((ptVar9->services_).super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (ptVar9->services_).super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"***",3);
    local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = (string)0xa;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)this_00,(char *)&local_e0,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"## Services",0xb);
    local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = (string)0xa;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_e0,1);
    local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_e0,1);
    std::vector<t_service_*,_std::allocator<t_service_*>_>::vector
              (&local_80,&((this->super_t_generator).program_)->services_);
    pptVar13 = (pointer)CONCAT71(local_80.
                                 super__Vector_base<t_service_*,_std::allocator<t_service_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start._1_7_,
                                 local_80.
                                 super__Vector_base<t_service_*,_std::allocator<t_service_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start._0_1_);
    if (pptVar13 !=
        local_80.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        (*(this->super_t_generator)._vptr_t_generator[0x1a])((string *)&local_e0,this,*pptVar13);
        std::__cxx11::string::operator=
                  ((string *)&(this->super_t_generator).service_name_,(string *)&local_e0);
        if ((pointer *)
            CONCAT71(local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
                     super__Vector_impl_data._M_start._1_7_,
                     local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
                     super__Vector_impl_data._M_start._0_1_) != ppptVar2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_e0.
                                   super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl
                                   .super__Vector_impl_data._M_start._1_7_,
                                   local_e0.
                                   super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl
                                   .super__Vector_impl_data._M_start._0_1_));
        }
        (*(this->super_t_generator)._vptr_t_generator[0x16])(this,*pptVar13);
        pptVar13 = pptVar13 + 1;
      } while (pptVar13 !=
               local_80.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
      pptVar13 = (pointer)CONCAT71(local_80.
                                   super__Vector_base<t_service_*,_std::allocator<t_service_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start._1_7_,
                                   local_80.
                                   super__Vector_base<t_service_*,_std::allocator<t_service_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start._0_1_);
    }
    if (pptVar13 != (pointer)0x0) {
      operator_delete(pptVar13);
    }
  }
  pvVar11 = &local_e0;
  local_e0.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.super__Vector_impl_data
  ._M_start._0_1_ = (string)0xa;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,(char *)pvVar11,1);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (this_00,(int)pvVar11);
  generate_index(this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_markdown_generator::generate_program() {
  // Make output directory
  MKDIR(get_out_dir().c_str());

  string pname = program_->get_name();
  current_file_ = make_file_name(pname);
  string fname = get_out_dir() + current_file_;
  f_out_.open(fname.c_str());
  f_out_ << "# Thrift module: " << pname << endl << endl;

  print_doc(program_);
  f_out_ << endl << endl;

  generate_program_toc();

  if (!program_->get_consts().empty()) {
    f_out_ << "***" << endl << "## Constants" << endl << endl;
    vector<t_const*> consts = program_->get_consts();
    f_out_ << "|Constant|Type|Value||" << endl
           << "|---|---|---|---|" << endl;
    generate_consts(consts);
    f_out_ << endl;
  }

  if (!program_->get_enums().empty()) {
    f_out_ << "***" << endl << "## Enumerations" << endl << endl;
    // Generate enums
    vector<t_enum*> enums = program_->get_enums();
    vector<t_enum*>::iterator en_iter;
    for (en_iter = enums.begin(); en_iter != enums.end(); ++en_iter) {
      generate_enum(*en_iter);
    }
  }

  if (!program_->get_typedefs().empty()) {
    f_out_ << "***" << endl << "## Type declarations" << endl << endl;
    // Generate typedefs
    vector<t_typedef*> typedefs = program_->get_typedefs();
    vector<t_typedef*>::iterator td_iter;
    for (td_iter = typedefs.begin(); td_iter != typedefs.end(); ++td_iter) {
      generate_typedef(*td_iter);
    }
  }

  if (!program_->get_objects().empty()) {
    f_out_ << "***" << endl << "## Data structures" << endl << endl;
    // Generate structs and exceptions in declared order
    vector<t_struct*> objects = program_->get_objects();
    vector<t_struct*>::iterator o_iter;
    for (o_iter = objects.begin(); o_iter != objects.end(); ++o_iter) {
      if ((*o_iter)->is_xception()) {
        generate_xception(*o_iter);
      } else {
        generate_struct(*o_iter);
      }
    }
  }

  if (!program_->get_services().empty()) {
    f_out_ << "***" << endl << "## Services" << endl << endl;
    // Generate services
    vector<t_service*> services = program_->get_services();
    vector<t_service*>::iterator sv_iter;
    for (sv_iter = services.begin(); sv_iter != services.end(); ++sv_iter) {
      service_name_ = get_service_name(*sv_iter);
      generate_service(*sv_iter);
    }
  }

  f_out_ << endl;
  f_out_.close();

  generate_index();
}